

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O3

void __thiscall
cppjieba::MPSegment::Cut
          (MPSegment *this,string *sentence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,size_t max_word_len)

{
  long lVar1;
  ulong uVar2;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> tmp;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> local_48;
  
  local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Cut(this,sentence,&local_48,max_word_len);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(words,((long)local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  if (local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((words->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (uVar2 < (ulong)(((long)local_48.
                                    super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x5555555555555555));
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(&local_48);
  return;
}

Assistant:

void Cut(const string& sentence,
        vector<string>& words,
        size_t max_word_len) const {
    vector<Word> tmp;
    Cut(sentence, tmp, max_word_len);
    GetStringsFromWords(tmp, words);
  }